

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

void LenPriceEnc_UpdateTable(CLenPriceEnc *p,UInt32 posState,UInt32 *ProbPrices)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  UInt32 UVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar1 = p->tableSize;
  uVar8 = (ulong)uVar1;
  uVar6 = (p->p).choice >> 2 & 0xfffffffc;
  iVar2 = *(int *)((long)ProbPrices + (ulong)uVar6);
  iVar3 = *(int *)((long)ProbPrices + (ulong)(uVar6 ^ 0x1fc));
  uVar6 = (p->p).choice2 >> 2 & 0xfffffffc;
  iVar4 = *(int *)((long)ProbPrices + (ulong)uVar6);
  iVar5 = *(int *)((long)ProbPrices + (ulong)(uVar6 ^ 0x1fc));
  for (uVar10 = 0; uVar10 != 8; uVar10 = uVar10 + 1) {
    if (uVar8 == uVar10) goto LAB_0010f9de;
    UVar7 = RcTree_GetPrice((p->p).low + (posState << 3),3,(UInt32)uVar10,ProbPrices);
    p->prices[posState][uVar10] = UVar7 + iVar2;
  }
  for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
    if (uVar8 <= lVar9 + 8U) goto LAB_0010f9de;
    UVar7 = RcTree_GetPrice((p->p).mid + (posState << 3),3,(UInt32)lVar9,ProbPrices);
    p->prices[posState][lVar9 + 8] = UVar7 + iVar4 + iVar3;
  }
  for (lVar9 = 0; lVar9 + 0x10U < uVar8; lVar9 = lVar9 + 1) {
    UVar7 = RcTree_GetPrice((p->p).high,8,(UInt32)lVar9,ProbPrices);
    p->prices[posState][lVar9 + 0x10] = UVar7 + iVar3 + iVar5;
  }
LAB_0010f9de:
  p->counters[posState] = uVar1;
  return;
}

Assistant:

static void MY_FAST_CALL LenPriceEnc_UpdateTable(CLenPriceEnc *p, UInt32 posState, const UInt32 *ProbPrices)
{
  LenEnc_SetPrices(&p->p, posState, p->tableSize, p->prices[posState], ProbPrices);
  p->counters[posState] = p->tableSize;
}